

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mul.c
# Opt level: O1

unsigned_long bn_add_part_words(unsigned_long *r,unsigned_long *a,unsigned_long *b,int cl,int dl)

{
  ulong uVar1;
  ulong uVar2;
  unsigned_long *puVar3;
  unsigned_long *puVar4;
  unsigned_long *puVar5;
  unsigned_long *puVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  unsigned_long uVar13;
  
  uVar1 = bn_add_words(r,a,b,cl);
  if (dl == 0) {
    return uVar1;
  }
  puVar3 = r + cl;
  if (dl < 0) {
    puVar5 = b + cl;
    puVar4 = puVar3;
    puVar6 = puVar5;
    iVar8 = dl;
    if (uVar1 == 0) {
      uVar2 = 0;
      iVar10 = dl;
    }
    else {
      lVar12 = 0;
      do {
        iVar7 = dl + (int)lVar12;
        uVar2 = (ulong)CARRY8(uVar1,puVar5[lVar12]);
        puVar3[lVar12] = uVar1 + puVar5[lVar12];
        iVar10 = 0;
        if (-2 < iVar7) goto LAB_00113f13;
        uVar13 = uVar2 + puVar5[lVar12 + 1];
        uVar2 = (ulong)CARRY8(uVar2,puVar5[lVar12 + 1]);
        puVar3[lVar12 + 1] = uVar13;
        iVar10 = 0;
        if (iVar7 == -2) goto LAB_00113f13;
        uVar13 = uVar2 + puVar5[lVar12 + 2];
        uVar2 = (ulong)CARRY8(uVar2,puVar5[lVar12 + 2]);
        puVar3[lVar12 + 2] = uVar13;
        iVar10 = 0;
        if (-4 < iVar7) goto LAB_00113f13;
        uVar11 = puVar5[lVar12 + 3] + uVar2;
        uVar1 = (ulong)CARRY8(puVar5[lVar12 + 3],uVar2);
        puVar3[lVar12 + 3] = uVar11;
        if (iVar7 == -4) {
          uVar2 = uVar1;
          iVar10 = 0;
          iVar8 = dl + (int)lVar12;
          goto LAB_00113f13;
        }
        iVar8 = iVar8 + 4;
        puVar6 = puVar6 + 4;
        puVar4 = puVar4 + 4;
        lVar12 = lVar12 + 4;
      } while (uVar11 < uVar2);
      iVar10 = dl + (int)lVar12;
      uVar2 = 0;
    }
LAB_00113f13:
    iVar7 = 0;
    if ((-1 < iVar10) || (iVar9 = iVar10 - iVar8, iVar7 = iVar10, iVar10 <= iVar8))
    goto LAB_00113fe8;
    if (iVar9 == 3) {
LAB_00113fd4:
      puVar4[3] = puVar6[3];
      iVar10 = iVar10 + 1;
    }
    else {
      if (iVar9 == 2) {
LAB_00113f48:
        puVar4[2] = puVar6[2];
        if (iVar10 < -1) {
          iVar10 = iVar10 + 1;
          goto LAB_00113fd4;
        }
      }
      else {
        if (iVar9 != 1) goto LAB_00113fde;
        puVar4[1] = puVar6[1];
        iVar10 = iVar10 + 1;
        if (iVar10 != 0) goto LAB_00113f48;
      }
      iVar10 = 0;
    }
LAB_00113fde:
    puVar6 = puVar6 + 4;
    puVar4 = puVar4 + 4;
    iVar7 = iVar10;
LAB_00113fe8:
    if (-1 < iVar7) {
      return uVar2;
    }
    *puVar4 = *puVar6;
    if (iVar7 == -1) {
      return uVar2;
    }
    lVar12 = 0;
    do {
      iVar8 = iVar7 + (int)lVar12;
      puVar4[lVar12 + 1] = puVar6[lVar12 + 1];
      if (iVar8 == -2) {
        return uVar2;
      }
      puVar4[lVar12 + 2] = puVar6[lVar12 + 2];
      if (-4 < iVar8) {
        return uVar2;
      }
      puVar4[lVar12 + 3] = puVar6[lVar12 + 3];
      if (iVar8 == -4) {
        return uVar2;
      }
      puVar4[lVar12 + 4] = puVar6[lVar12 + 4];
      lVar12 = lVar12 + 4;
    } while (iVar7 + -4 + (int)lVar12 < -5);
    return uVar2;
  }
  puVar5 = a + cl;
  if (uVar1 != 0) {
    do {
      uVar2 = (ulong)CARRY8(uVar1,a[cl]);
      r[cl] = uVar1 + a[cl];
      uVar1 = uVar2;
      if (dl < 2) {
LAB_00113ea6:
        iVar8 = 0;
        goto LAB_00113ecb;
      }
      uVar1 = (ulong)CARRY8(uVar2,a[(long)cl + 1]);
      r[(long)cl + 1] = uVar2 + a[(long)cl + 1];
      if (dl == 2) {
LAB_00113ec9:
        iVar8 = 0;
        goto LAB_00113ecb;
      }
      uVar2 = (ulong)CARRY8(uVar1,a[(long)cl + 2]);
      r[(long)cl + 2] = uVar1 + a[(long)cl + 2];
      uVar1 = uVar2;
      if (dl < 4) goto LAB_00113ea6;
      uVar11 = a[(long)cl + 3] + uVar2;
      uVar1 = (ulong)CARRY8(a[(long)cl + 3],uVar2);
      r[(long)cl + 3] = uVar11;
      if (dl == 4) {
        puVar5 = a + cl;
        puVar3 = r + cl;
        goto LAB_00113ec9;
      }
      dl = dl + -4;
      puVar5 = puVar5 + 4;
      puVar3 = puVar3 + 4;
      a = a + 4;
      r = r + 4;
    } while (uVar11 < uVar2);
  }
  uVar1 = 0;
  iVar8 = dl;
LAB_00113ecb:
  iVar10 = 0;
  if ((iVar8 < 1) || (iVar7 = dl - iVar8, iVar10 = iVar8, dl <= iVar8)) goto LAB_00113f72;
  if (iVar7 == 3) {
LAB_00113f5e:
    puVar3[3] = puVar5[3];
    iVar10 = iVar8 + -1;
  }
  else {
    if (iVar7 == 2) {
LAB_00113ef9:
      puVar3[2] = puVar5[2];
      if (1 < iVar8) {
        iVar8 = iVar8 + -1;
        goto LAB_00113f5e;
      }
    }
    else {
      if (iVar7 != 1) goto LAB_00113f68;
      puVar3[1] = puVar5[1];
      if (iVar8 != 1) {
        iVar8 = iVar8 + -1;
        goto LAB_00113ef9;
      }
    }
    iVar10 = 0;
  }
LAB_00113f68:
  puVar5 = puVar5 + 4;
  puVar3 = puVar3 + 4;
LAB_00113f72:
  if ((0 < iVar10) && (*puVar3 = *puVar5, iVar10 != 1)) {
    lVar12 = 4;
    iVar8 = iVar10 + 4;
    while (puVar3[lVar12 + -3] = puVar5[lVar12 + -3], iVar8 != 6) {
      iVar10 = iVar8 + -4;
      puVar3[lVar12 + -2] = puVar5[lVar12 + -2];
      if (iVar10 < 4) {
        return uVar1;
      }
      puVar3[lVar12 + -1] = puVar5[lVar12 + -1];
      if (iVar8 == 8) {
        return uVar1;
      }
      puVar3[lVar12] = puVar5[lVar12];
      lVar12 = lVar12 + 4;
      iVar8 = iVar10;
      if (iVar10 < 6) {
        return uVar1;
      }
    }
  }
  return uVar1;
}

Assistant:

BN_ULONG bn_add_part_words(BN_ULONG *r,
                           const BN_ULONG *a, const BN_ULONG *b,
                           int cl, int dl)
{
    BN_ULONG c, l, t;

    assert(cl >= 0);
    c = bn_add_words(r, a, b, cl);

    if (dl == 0)
        return c;

    r += cl;
    a += cl;
    b += cl;

    if (dl < 0) {
        int save_dl = dl;
        while (c) {
            l = (c + b[0]) & BN_MASK2;
            c = (l < c);
            r[0] = l;
            if (++dl >= 0)
                break;

            l = (c + b[1]) & BN_MASK2;
            c = (l < c);
            r[1] = l;
            if (++dl >= 0)
                break;

            l = (c + b[2]) & BN_MASK2;
            c = (l < c);
            r[2] = l;
            if (++dl >= 0)
                break;

            l = (c + b[3]) & BN_MASK2;
            c = (l < c);
            r[3] = l;
            if (++dl >= 0)
                break;

            save_dl = dl;
            b += 4;
            r += 4;
        }
        if (dl < 0) {
            if (save_dl < dl) {
                switch (dl - save_dl) {
                case 1:
                    r[1] = b[1];
                    if (++dl >= 0)
                        break;
                case 2:
                    r[2] = b[2];
                    if (++dl >= 0)
                        break;
                case 3:
                    r[3] = b[3];
                    if (++dl >= 0)
                        break;
                }
                b += 4;
                r += 4;
            }
        }
        if (dl < 0) {
            for (;;) {
                r[0] = b[0];
                if (++dl >= 0)
                    break;
                r[1] = b[1];
                if (++dl >= 0)
                    break;
                r[2] = b[2];
                if (++dl >= 0)
                    break;
                r[3] = b[3];
                if (++dl >= 0)
                    break;

                b += 4;
                r += 4;
            }
        }
    } else {
        int save_dl = dl;
        while (c) {
            t = (a[0] + c) & BN_MASK2;
            c = (t < c);
            r[0] = t;
            if (--dl <= 0)
                break;

            t = (a[1] + c) & BN_MASK2;
            c = (t < c);
            r[1] = t;
            if (--dl <= 0)
                break;

            t = (a[2] + c) & BN_MASK2;
            c = (t < c);
            r[2] = t;
            if (--dl <= 0)
                break;

            t = (a[3] + c) & BN_MASK2;
            c = (t < c);
            r[3] = t;
            if (--dl <= 0)
                break;

            save_dl = dl;
            a += 4;
            r += 4;
        }
        if (dl > 0) {
            if (save_dl > dl) {
                switch (save_dl - dl) {
                case 1:
                    r[1] = a[1];
                    if (--dl <= 0)
                        break;
                case 2:
                    r[2] = a[2];
                    if (--dl <= 0)
                        break;
                case 3:
                    r[3] = a[3];
                    if (--dl <= 0)
                        break;
                }
                a += 4;
                r += 4;
            }
        }
        if (dl > 0) {
            for (;;) {
                r[0] = a[0];
                if (--dl <= 0)
                    break;
                r[1] = a[1];
                if (--dl <= 0)
                    break;
                r[2] = a[2];
                if (--dl <= 0)
                    break;
                r[3] = a[3];
                if (--dl <= 0)
                    break;

                a += 4;
                r += 4;
            }
        }
    }
    return c;
}